

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cba.h
# Opt level: O1

void Cba_ObjSetFinFon(Cba_Ntk_t *p,int i,int k,int x)

{
  int *piVar1;
  uint uVar2;
  char *__assertion;
  
  if (i < 1) {
    __assertion = "i>0";
LAB_003e1fe3:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                  ,0x101,"void Cba_ObjSetFinFon(Cba_Ntk_t *, int, int, int)");
  }
  if (i < (p->vObjFin0).nSize) {
    piVar1 = (p->vObjFin0).pArray + (uint)i;
    uVar2 = k + *piVar1;
    if (uVar2 == 0 || SCARRY4(k,*piVar1) != (int)uVar2 < 0) {
      __assert_fail("f>0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                    ,0xfc,"int Cba_FinFon(Cba_Ntk_t *, int)");
    }
    if ((int)uVar2 < (p->vFinFon).nSize) {
      if ((p->vFinFon).pArray[uVar2] == 0) {
        if ((int)uVar2 < (p->vFinFon).nSize) {
          (p->vFinFon).pArray[uVar2] = x;
          return;
        }
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      __assertion = "Cba_ObjFinFon(p, i, k)== 0";
      goto LAB_003e1fe3;
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

static inline void           Cba_ObjSetFinFon( Cba_Ntk_t * p, int i, int k, int x ) { assert(i>0); assert(Cba_ObjFinFon(p, i, k)== 0); Vec_IntWriteEntry(&p->vFinFon, Cba_ObjFin(p, i, k), x); }